

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadEventType(BinaryReader *this,Index *out_sig_index)

{
  Result RVar1;
  Enum EVar2;
  uint32_t attribute;
  uint32_t value;
  uint32_t local_20;
  Index local_1c;
  
  RVar1 = ReadU32Leb128(this,&local_20,"event attribute");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (local_20 == 0) {
      RVar1 = ReadU32Leb128(this,&local_1c,"event signature index");
      if (RVar1.enum_ != Error) {
        *out_sig_index = local_1c;
      }
      EVar2 = (Enum)(RVar1.enum_ == Error);
    }
    else {
      PrintError(this,"event attribute must be 0");
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadEventType(Index* out_sig_index) {
  uint32_t attribute;
  CHECK_RESULT(ReadU32Leb128(&attribute, "event attribute"));
  ERROR_UNLESS(attribute == 0, "event attribute must be 0");
  CHECK_RESULT(ReadIndex(out_sig_index, "event signature index"));
  return Result::Ok;
}